

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

int Gia_ManCorrSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  uVar2 = *(ulong *)pObj;
  if ((uVar2 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar2 < 0) {
    uVar8 = (uint)uVar2 & 0x9fffffff;
    uVar7 = (uint)(uVar2 >> 0x20);
    if (f != 0) {
      if (uVar8 == 0x9fffffff) {
        uVar7 = uVar7 & 0x1fffffff;
        iVar9 = p->vCis->nSize;
        if (iVar9 - p->nRegs <= (int)uVar7) {
          iVar1 = p->vCos->nSize;
          uVar7 = (iVar1 - iVar9) + uVar7;
          if ((-1 < (int)uVar7) && ((int)uVar7 < iVar1)) {
            iVar9 = p->vCos->pArray[uVar7];
            if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar6 = p->pObjs + iVar9;
            Gia_ManCorrSpecReduce_rec
                      (pNew,p,pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff),f + -1,nPrefix);
            pGVar4 = pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff);
            pGVar3 = p->pObjs;
            if ((pGVar4 < pGVar3) || (pGVar3 + p->nObjs <= pGVar4)) goto LAB_00649a73;
            uVar7 = (int)((ulong)((long)pGVar4 - (long)pGVar3) >> 2) * -0x55555555 +
                    p->nObjs * (f + -1);
            if ((-1 < (int)uVar7) && ((int)uVar7 < (p->vCopies).nSize)) {
              uVar7 = (p->vCopies).pArray[uVar7];
              if (-1 < (int)uVar7) {
                return uVar7 ^ (uint)(*(ulong *)pGVar6 >> 0x1d) & 1;
              }
              goto LAB_00649a92;
            }
          }
          goto LAB_00649a54;
        }
      }
      __assert_fail("f && Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                    ,0x3c,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    if ((uVar8 != 0x9fffffff) || ((int)(uVar7 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                    ,0x39,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    pGVar6 = p->pObjs;
    if ((pGVar6 <= pObj) && (pObj < pGVar6 + p->nObjs)) {
      uVar7 = (int)((long)pObj - (long)pGVar6 >> 2) * -0x55555555;
      if ((-1 < (int)uVar7) && ((int)uVar7 < (p->vCopies).nSize)) {
        return (p->vCopies).pArray[uVar7 & 0x7fffffff];
      }
LAB_00649a54:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  else {
    Gia_ManCorrSpecReduce_rec(pNew,p,pObj + -(uVar2 & 0x1fffffff),f,nPrefix);
    Gia_ManCorrSpecReduce_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),f,nPrefix);
    uVar2 = *(ulong *)pObj;
    pGVar6 = pObj + -(uVar2 & 0x1fffffff);
    pGVar4 = p->pObjs;
    if (pGVar4 <= pGVar6) {
      if (pGVar6 < pGVar4 + p->nObjs) {
        iVar9 = p->nObjs * f;
        uVar7 = (int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555 + iVar9;
        if (((int)uVar7 < 0) || (uVar8 = (p->vCopies).nSize, (int)uVar8 <= (int)uVar7))
        goto LAB_00649a54;
        piVar5 = (p->vCopies).pArray;
        uVar7 = piVar5[uVar7];
        if (-1 < (int)uVar7) {
          uVar11 = (uint)(uVar2 >> 0x20);
          pGVar6 = pObj + -(ulong)(uVar11 & 0x1fffffff);
          if ((pGVar6 < pGVar4) || (pGVar4 + p->nObjs <= pGVar6)) goto LAB_00649a73;
          uVar10 = iVar9 + (int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555;
          if (((int)uVar10 < 0) || (uVar8 <= uVar10)) goto LAB_00649a54;
          uVar8 = piVar5[uVar10];
          if (-1 < (int)uVar8) {
            iVar9 = Gia_ManHashAnd(pNew,uVar7 ^ (uint)(uVar2 >> 0x1d) & 1,uVar8 ^ uVar11 >> 0x1d & 1
                                  );
            return iVar9;
          }
        }
LAB_00649a92:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
    }
  }
LAB_00649a73:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManCorrSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f, nPrefix );
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj), f, nPrefix );
        return Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj) );
    }
    if ( f == 0 )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        return Gia_ObjCopyF(p, f, pObj);
    }
    assert( f && Gia_ObjIsRo(p, pObj) );
    pObj = Gia_ObjRoToRi( p, pObj );
    Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f-1, nPrefix );
    return Gia_ObjFanin0CopyF( p, f-1, pObj );
}